

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBStringList::splitstr(CBStringList *this,CBString *b,CBString *s)

{
  uchar splitChar;
  int iVar1;
  int left;
  long lVar2;
  CBString local_58;
  const_bstring local_40;
  const_bstring local_38;
  
  iVar1 = (s->super_tagbstring).slen;
  if (iVar1 == 1) {
    splitChar = CBString::character(s,0);
    split(this,b,splitChar);
    return;
  }
  if (iVar1 == 0) {
    if (0 < (b->super_tagbstring).slen) {
      lVar2 = 0;
      do {
        CBString::CBString(&local_58,(b->super_tagbstring).data[lVar2]);
        std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
        emplace_back<Bstrlib::CBString>
                  ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_58);
        local_58._vptr_CBString = (_func_int **)&PTR__CBString_001a9830;
        if (local_58.super_tagbstring.data != (uchar *)0x0) {
          free(local_58.super_tagbstring.data);
          local_58.super_tagbstring.data = (uchar *)0x0;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < (b->super_tagbstring).slen);
    }
  }
  else {
    local_38 = &b->super_tagbstring;
    local_40 = &s->super_tagbstring;
    left = 0;
    iVar1 = binstr(local_38,0,local_40);
    if (-1 < iVar1) {
      left = 0;
      do {
        CBString::midstr(&local_58,b,left,iVar1 - left);
        std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
        emplace_back<Bstrlib::CBString>
                  ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_58);
        local_58._vptr_CBString = (_func_int **)&PTR__CBString_001a9830;
        if (local_58.super_tagbstring.data != (uchar *)0x0) {
          free(local_58.super_tagbstring.data);
          local_58.super_tagbstring.data = (uchar *)0x0;
        }
        left = iVar1 + (s->super_tagbstring).slen;
        iVar1 = binstr(local_38,left,local_40);
      } while (-1 < iVar1);
    }
    iVar1 = (b->super_tagbstring).slen;
    if (left <= iVar1) {
      CBString::midstr(&local_58,b,left,iVar1 - left);
      std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
      emplace_back<Bstrlib::CBString>
                ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_58);
      local_58._vptr_CBString = (_func_int **)&PTR__CBString_001a9830;
      if (local_58.super_tagbstring.data != (uchar *)0x0) {
        free(local_58.super_tagbstring.data);
      }
    }
  }
  return;
}

Assistant:

void CBStringList::splitstr (const CBString& b, const CBString& s) {
int p, i;

	if (s.length() == 1) {
		this->split (b, s.character (0));
	} else if (s.length() == 0) {
		for (i=0; i < b.length (); i++) {
			this->push_back (CBString (b.data[i]));
		}
	} else {
		for (p=0; (i = b.find (s, p)) >= 0; p = i + s.length ()) {
			this->push_back (b.midstr (p, i - p));
		}
		if (p <= b.length ()) {
			this->push_back (b.midstr (p, b.length () - p));
		}
	}
}